

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

CoverageBinSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::CoverageBinSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1)

{
  SourceLocation SVar1;
  size_t sVar2;
  char *pcVar3;
  CoverageBinSymbol *pCVar4;
  
  pCVar4 = (CoverageBinSymbol *)allocate(this,0x98,8);
  sVar2 = args->_M_len;
  pcVar3 = args->_M_str;
  SVar1 = *args_1;
  (pCVar4->super_Symbol).kind = CoverageBin;
  (pCVar4->super_Symbol).name._M_len = sVar2;
  (pCVar4->super_Symbol).name._M_str = pcVar3;
  (pCVar4->super_Symbol).location = SVar1;
  (pCVar4->super_Symbol).indexInScope = 0;
  (pCVar4->super_Symbol).parentScope = (Scope *)0x0;
  (pCVar4->super_Symbol).nextInScope = (Symbol *)0x0;
  *(undefined8 *)((long)&(pCVar4->transList)._M_ptr + 1) = 0;
  *(undefined8 *)((long)&(pCVar4->transList)._M_extent._M_extent_value + 1) = 0;
  (pCVar4->values)._M_extent._M_extent_value = 0;
  (pCVar4->transList)._M_ptr = (pointer)0x0;
  pCVar4->selectExpr = (BinsSelectExpr *)0x0;
  (pCVar4->values)._M_ptr = (pointer)0x0;
  pCVar4->setCoverageExpr = (Expression *)0x0;
  pCVar4->withExpr = (Expression *)0x0;
  pCVar4->numberOfBinsExpr = (Expression *)0x0;
  pCVar4->iffExpr = (Expression *)0x0;
  (pCVar4->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  pCVar4->binsKind = Bins;
  pCVar4->isArray = false;
  pCVar4->isWildcard = false;
  pCVar4->isDefault = false;
  pCVar4->isDefaultSequence = false;
  return pCVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }